

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc.c++:36:13)>
::getImpl(SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *pEVar1;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *in;
  Promise<kj::Maybe<capnp::MessageReaderAndFds>_> local_568;
  ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> local_560;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *local_3b8;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *depValue;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *_depValue779;
  Exception *local_200;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1e0 [8];
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
  *this_local;
  
  depResult.value.ptr.field_1._32_8_ = output;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
            ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             local_1e0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1e0);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1e0);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
                         ((Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                           *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                     details.builder + 0x18));
    if (depValue != (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)0x0) {
      local_3b8 = depValue;
      in = mv<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>(depValue);
      MaybeVoidCaller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>>>
      ::
      apply<capnp::WebSocketMessageStream::tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
                ((MaybeVoidCaller<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>>>
                  *)&local_568,&this->func,in);
      TransformPromiseNodeBase::handle<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>>>
                (&local_560,&this->super_TransformPromiseNodeBase,&local_568);
      pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>>>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
      ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
                (pEVar1,&local_560);
      ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::~ExceptionOr(&local_560);
      Promise<kj::Maybe<capnp::MessageReaderAndFds>_>::~Promise(&local_568);
    }
  }
  else {
    local_200 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::ExceptionOr
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)&_depValue779,
               false,exception);
    pEVar1 = ExceptionOrValue::as<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>>>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1._32_8_);
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              (pEVar1,(ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)
                      &_depValue779);
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::~ExceptionOr
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)&_depValue779);
  }
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~ExceptionOr
            ((ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             local_1e0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }